

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O1

REF_STATUS ref_iso_signed_distance(REF_GRID_conflict ref_grid,REF_DBL *field,REF_DBL *distance)

{
  REF_CELL ref_cell;
  REF_DBL *pRVar1;
  uint uVar2;
  REF_STATUS RVar3;
  uint uVar4;
  REF_NODE pRVar5;
  undefined8 uVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  int cell;
  double dVar10;
  REF_LIST ref_list;
  REF_SEARCH ref_search;
  REF_GRID_conflict iso_grid;
  REF_DBL dist;
  REF_DBL radius;
  REF_INT cand [27];
  REF_DBL center [3];
  REF_INT nodes [27];
  REF_LIST local_168;
  REF_SEARCH local_160;
  REF_GRID local_158;
  double local_150;
  double local_148;
  REF_DBL *local_140;
  int local_138;
  int local_134;
  int local_130;
  REF_DBL local_c8 [4];
  REF_INT local_a8 [30];
  
  local_160 = (REF_SEARCH)0x0;
  uVar2 = ref_iso_insert(&local_158,ref_grid,field,0,(REF_DBL *)0x0,(REF_DBL **)0x0);
  if (uVar2 == 0) {
    lVar7 = 0x10;
    if (ref_grid->twod == 0) {
      lVar7 = 0x28;
    }
    ref_cell = *(REF_CELL *)((long)local_158->cell + lVar7 + -0x10);
    uVar2 = ref_search_create(&local_160,ref_cell->n);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x15a,
             "ref_iso_signed_distance",(ulong)uVar2,"create search");
      return uVar2;
    }
    uVar2 = 0;
    local_140 = field;
    if (0 < ref_cell->max) {
      cell = 0;
      do {
        RVar3 = ref_cell_nodes(ref_cell,cell,local_a8);
        if (RVar3 == 0) {
          if (ref_grid->twod == 0) {
            uVar4 = ref_node_bounding_sphere(local_158->node,local_a8,3,local_c8,&local_148);
            if (uVar4 != 0) {
              uVar6 = 0x163;
              uVar2 = uVar4;
              goto LAB_00174c19;
            }
          }
          else {
            uVar4 = ref_node_bounding_sphere(local_158->node,local_a8,2,local_c8,&local_148);
            if (uVar4 != 0) {
              uVar6 = 0x15f;
              uVar2 = uVar4;
LAB_00174c19:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                     ,uVar6,"ref_iso_signed_distance",(ulong)uVar2,"b");
              uVar4 = uVar2;
            }
          }
          if (uVar4 != 0) {
            return uVar2;
          }
          uVar4 = ref_search_insert(local_160,cell,local_c8,local_148 * 1.00000001);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                   0x165,"ref_iso_signed_distance",(ulong)uVar4,"ins");
            return uVar4;
          }
        }
        cell = cell + 1;
      } while (cell < ref_cell->max);
    }
    uVar4 = ref_list_create(&local_168);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x167,
             "ref_iso_signed_distance",(ulong)uVar4,"create list");
      return uVar4;
    }
    pRVar5 = ref_grid->node;
    if (0 < pRVar5->max) {
      lVar7 = 0;
      do {
        if (-1 < pRVar5->global[lVar7]) {
          distance[lVar7] = 1e+200;
          uVar4 = ref_search_nearest_candidates(local_160,local_168,pRVar5->real + lVar7 * 0xf);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                   0x16d,"ref_iso_signed_distance",(ulong)uVar4,"candidates");
            return uVar4;
          }
          if (0 < local_168->n) {
            lVar9 = 0;
            do {
              uVar4 = ref_cell_nodes(ref_cell,local_168->value[lVar9],&local_138);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                       ,0x170,"ref_iso_signed_distance",(ulong)uVar4,"cell");
                return uVar4;
              }
              pRVar1 = local_158->node->real;
              if (ref_grid->twod == 0) {
                uVar4 = ref_search_distance3
                                  (pRVar1 + (long)local_138 * 0xf,pRVar1 + (long)local_134 * 0xf,
                                   pRVar1 + (long)local_130 * 0xf,ref_grid->node->real + lVar7 * 0xf
                                   ,&local_150);
                if (uVar4 != 0) {
                  uVar6 = 0x17d;
                  pcVar8 = "dist3";
                  uVar2 = uVar4;
                  goto LAB_00174ec7;
                }
              }
              else {
                uVar4 = ref_search_distance2
                                  (pRVar1 + (long)local_138 * 0xf,pRVar1 + (long)local_134 * 0xf,
                                   ref_grid->node->real + lVar7 * 0xf,&local_150);
                if (uVar4 != 0) {
                  uVar6 = 0x176;
                  pcVar8 = "dist2";
                  uVar2 = uVar4;
LAB_00174ec7:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                         ,uVar6,"ref_iso_signed_distance",(ulong)uVar2,pcVar8);
                  uVar4 = uVar2;
                }
              }
              if (uVar4 != 0) {
                return uVar2;
              }
              dVar10 = distance[lVar7];
              if (local_150 <= distance[lVar7]) {
                dVar10 = local_150;
              }
              distance[lVar7] = dVar10;
              lVar9 = lVar9 + 1;
            } while (lVar9 < local_168->n);
          }
          if (local_140[lVar7] <= 0.0 && local_140[lVar7] != 0.0) {
            distance[lVar7] = -distance[lVar7];
          }
          uVar4 = ref_list_erase(local_168);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                   0x185,"ref_iso_signed_distance",(ulong)uVar4,"reset list");
            return uVar4;
          }
        }
        lVar7 = lVar7 + 1;
        pRVar5 = ref_grid->node;
      } while (lVar7 < pRVar5->max);
    }
    uVar2 = ref_list_free(local_168);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x187,
             "ref_iso_signed_distance",(ulong)uVar2,"free list");
      return uVar2;
    }
    uVar2 = ref_search_free(local_160);
    if (uVar2 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x188,
             "ref_iso_signed_distance",(ulong)uVar2,"free search");
      return uVar2;
    }
    uVar2 = ref_grid_free(local_158);
    if (uVar2 == 0) {
      return 0;
    }
    pcVar8 = "iso free";
    uVar6 = 0x18a;
  }
  else {
    pcVar8 = "iso";
    uVar6 = 0x153;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",uVar6,
         "ref_iso_signed_distance",(ulong)uVar2,pcVar8);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_iso_signed_distance(REF_GRID ref_grid, REF_DBL *field,
                                           REF_DBL *distance) {
  REF_GRID iso_grid;
  REF_SEARCH ref_search = NULL;
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER], cand[REF_CELL_MAX_SIZE_PER];
  REF_DBL center[3], radius, dist;
  REF_DBL scale = 1.0 + 1.0e-8;
  REF_LIST ref_list;
  REF_INT node, item, candidate;

  RSS(ref_iso_insert(&iso_grid, ref_grid, field, 0, NULL, NULL), "iso");

  if (ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_edg(iso_grid);
  } else {
    ref_cell = ref_grid_tri(iso_grid);
  }
  RSS(ref_search_create(&ref_search, ref_cell_n(ref_cell)), "create search");
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (ref_grid_twod(ref_grid)) {
      RSS(ref_node_bounding_sphere(ref_grid_node(iso_grid), nodes, 2, center,
                                   &radius),
          "b");
    } else {
      RSS(ref_node_bounding_sphere(ref_grid_node(iso_grid), nodes, 3, center,
                                   &radius),
          "b");
    }
    RSS(ref_search_insert(ref_search, cell, center, scale * radius), "ins");
  }
  RSS(ref_list_create(&ref_list), "create list");
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    distance[node] = REF_DBL_MAX;
    RSS(ref_search_nearest_candidates(
            ref_search, ref_list,
            ref_node_xyz_ptr(ref_grid_node(ref_grid), node)),
        "candidates");
    each_ref_list_item(ref_list, item) {
      candidate = ref_list_value(ref_list, item);
      RSS(ref_cell_nodes(ref_cell, candidate, cand), "cell");
      if (ref_grid_twod(ref_grid)) {
        RSS(ref_search_distance2(
                ref_node_xyz_ptr(ref_grid_node(iso_grid), cand[0]),
                ref_node_xyz_ptr(ref_grid_node(iso_grid), cand[1]),
                ref_node_xyz_ptr(ref_grid_node(ref_grid), node), &dist),
            "dist2");
      } else {
        RSS(ref_search_distance3(
                ref_node_xyz_ptr(ref_grid_node(iso_grid), cand[0]),
                ref_node_xyz_ptr(ref_grid_node(iso_grid), cand[1]),
                ref_node_xyz_ptr(ref_grid_node(iso_grid), cand[2]),
                ref_node_xyz_ptr(ref_grid_node(ref_grid), node), &dist),
            "dist3");
      }
      distance[node] = MIN(distance[node], dist);
    }

    /* sign distanace */
    if (0.0 > field[node]) distance[node] = -distance[node];

    RSS(ref_list_erase(ref_list), "reset list");
  }
  RSS(ref_list_free(ref_list), "free list");
  RSS(ref_search_free(ref_search), "free search");

  RSS(ref_grid_free(iso_grid), "iso free");

  return REF_SUCCESS;
}